

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

void Abc_NtkFrameExtend(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  uint *__ptr;
  void *pvVar5;
  void *pvVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  char *pcVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pAVar12;
  Vec_Ptr_t *pVVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  
  iVar16 = pNtk->nConstrs;
  if (iVar16 == 0) {
    return;
  }
  pVVar13 = pNtk->vPis;
  uVar1 = pVVar13->nSize;
  lVar14 = (long)(int)uVar1;
  if ((int)uVar1 < iVar16) {
    __assert_fail("Abc_NtkPiNum(pNtk) >= pNtk->nConstrs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                  ,0x111,"void Abc_NtkFrameExtend(Abc_Ntk_t *)");
  }
  uVar2 = pNtk->vPos->nSize;
  lVar15 = (long)(int)uVar2;
  if ((int)uVar2 < iVar16 * 4) {
    __assert_fail("Abc_NtkPoNum(pNtk) >= pNtk->nConstrs * 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                  ,0x112,"void Abc_NtkFrameExtend(Abc_Ntk_t *)");
  }
  uVar20 = pNtk->nObjCounts[7];
  __ptr = (uint *)malloc(0x10);
  uVar22 = 8;
  if (6 < uVar20 - 1) {
    uVar22 = (ulong)uVar20;
  }
  __ptr[1] = 0;
  uVar20 = (uint)uVar22;
  *__ptr = uVar20;
  uVar17 = 0;
  if (uVar20 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar20 << 3);
  }
  *(void **)(__ptr + 2) = pvVar5;
  pVVar7 = pNtk->vObjs;
  if (0 < pVVar7->nSize) {
    uVar17 = 0;
    lVar23 = 0;
    do {
      pvVar5 = pVVar7->pArray[lVar23];
      if ((pvVar5 != (void *)0x0) && ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7)) {
        iVar16 = (int)uVar17;
        iVar21 = (int)uVar22;
        if (iVar16 == iVar21) {
          if (iVar21 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar6;
            *__ptr = 0x10;
            uVar22 = 0x10;
          }
          else {
            uVar22 = (ulong)(uint)(iVar21 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(uVar22 * 8);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),uVar22 * 8);
            }
            *(void **)(__ptr + 2) = pvVar6;
            *__ptr = iVar21 * 2;
          }
        }
        else {
          pvVar6 = *(void **)(__ptr + 2);
        }
        __ptr[1] = iVar16 + 1U;
        *(void **)((long)pvVar6 + (long)iVar16 * 8) = pvVar5;
        pVVar7 = pNtk->vObjs;
        uVar17 = (ulong)(iVar16 + 1U);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < pVVar7->nSize);
    pVVar13 = pNtk->vPis;
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 8;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(0x40);
  pVVar7->pArray = ppvVar8;
  if (0 < pVVar13->nSize) {
    lVar18 = lVar15 + lVar14 * -4;
    lVar23 = 0;
    lVar19 = 0;
    do {
      if ((ulong)uVar1 << 2 == lVar23) break;
      pAVar3 = *(Abc_Obj_t **)((long)pVVar13->pArray + lVar23 * 2);
      if (lVar19 < lVar14 - pNtk->nConstrs) {
        Abc_NtkDupObj(pNtk,pAVar3,0);
        pAVar12 = (pAVar3->field_6).pCopy;
        pcVar9 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar12,pcVar9,"_frame1");
      }
      else {
        if (lVar18 + lVar23 < -1) {
LAB_002b0c40:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar20 = pNtk->vPos->nSize;
        if ((((long)(int)uVar20 <= lVar18 + lVar23 + 1) || ((ulong)uVar20 <= lVar18 + lVar23 + 2U))
           || ((ulong)uVar20 <= lVar18 + lVar23 + 3U)) goto LAB_002b0c40;
        ppvVar8 = pNtk->vPos->pArray;
        pAVar12 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*ppvVar8[lVar14 * -4 + lVar15 + lVar23 + 2] + 0x20) + 8) +
                   (long)**(int **)((long)ppvVar8[lVar14 * -4 + lVar15 + lVar23 + 2] + 0x20) * 8);
        pvVar5 = *(void **)(*(long *)(*(long *)(*ppvVar8[lVar14 * -4 + lVar15 + lVar23 + 3] + 0x20)
                                     + 8) +
                           (long)**(int **)((long)ppvVar8[lVar14 * -4 + lVar15 + lVar23 + 3] + 0x20)
                           * 8);
        pAVar10 = Abc_NtkCreateNodeInv
                            (pNtk,*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*ppvVar8[lVar14 * -4 + lVar15 + lVar23 + 1]
                                                       + 0x20) + 8) +
                                   (long)**(int **)((long)ppvVar8[lVar14 * -4 + lVar15 + lVar23 + 1]
                                                   + 0x20) * 8));
        pAVar11 = Abc_NtkCreateNodeInv(pNtk,pAVar12);
        ppvVar8 = pVVar7->pArray;
        if (pVVar7->nCap < 2) {
          if (ppvVar8 == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x10);
          }
          else {
            ppvVar8 = (void **)realloc(ppvVar8,0x10);
          }
          pVVar7->pArray = ppvVar8;
          pVVar7->nCap = 2;
        }
        *ppvVar8 = pAVar11;
        pVVar7->pArray[1] = pAVar3;
        pVVar7->nSize = 2;
        pAVar11 = Abc_NtkCreateNodeAnd(pNtk,pVVar7);
        ppvVar8 = pVVar7->pArray;
        if (pVVar7->nCap < 2) {
          if (ppvVar8 == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x10);
          }
          else {
            ppvVar8 = (void **)realloc(ppvVar8,0x10);
          }
          pVVar7->pArray = ppvVar8;
          pVVar7->nCap = 2;
        }
        *ppvVar8 = pAVar12;
        pVVar7->pArray[1] = pvVar5;
        pVVar7->nSize = 2;
        pAVar12 = Abc_NtkCreateNodeAnd(pNtk,pVVar7);
        ppvVar8 = pVVar7->pArray;
        if (pVVar7->nCap < 2) {
          if (ppvVar8 == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x10);
          }
          else {
            ppvVar8 = (void **)realloc(ppvVar8,0x10);
          }
          pVVar7->pArray = ppvVar8;
          pVVar7->nCap = 2;
        }
        *ppvVar8 = pAVar11;
        pVVar7->pArray[1] = pAVar12;
        pVVar7->nSize = 2;
        pAVar12 = Abc_NtkCreateNodeOr(pNtk,pVVar7);
        ppvVar8 = pVVar7->pArray;
        if (pVVar7->nCap < 2) {
          if (ppvVar8 == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x10);
          }
          else {
            ppvVar8 = (void **)realloc(ppvVar8,0x10);
          }
          pVVar7->pArray = ppvVar8;
          pVVar7->nCap = 2;
        }
        *ppvVar8 = pAVar10;
        pVVar7->pArray[1] = pAVar12;
        pVVar7->nSize = 2;
        pAVar12 = Abc_NtkCreateNodeAnd(pNtk,pVVar7);
        (pAVar3->field_6).pCopy = pAVar12;
      }
      lVar19 = lVar19 + 1;
      pVVar13 = pNtk->vPis;
      lVar23 = lVar23 + 4;
    } while (lVar19 < pVVar13->nSize);
  }
  if (0 < (int)uVar17) {
    lVar14 = *(long *)(__ptr + 2);
    uVar22 = 0;
    do {
      Abc_NtkDupObj(pNtk,*(Abc_Obj_t **)(lVar14 + uVar22 * 8),0);
      uVar22 = uVar22 + 1;
    } while (uVar17 != uVar22);
    if (0 < (int)uVar17) {
      lVar14 = *(long *)(__ptr + 2);
      uVar22 = 0;
      do {
        plVar4 = *(long **)(lVar14 + uVar22 * 8);
        if (0 < *(int *)((long)plVar4 + 0x1c)) {
          lVar23 = 0;
          do {
            Abc_ObjAddFanin((Abc_Obj_t *)plVar4[8],
                            *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                       (long)*(int *)(plVar4[4] + lVar23 * 4) * 8) + 0x40));
            lVar23 = lVar23 + 1;
          } while (lVar23 < *(int *)((long)plVar4 + 0x1c));
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar17);
    }
  }
  pVVar13 = pNtk->vPos;
  if (0 < pVVar13->nSize) {
    uVar22 = 0;
    do {
      if (uVar2 == uVar22) break;
      pAVar3 = (Abc_Obj_t *)pVVar13->pArray[uVar22];
      if ((long)uVar22 < lVar15 + (long)pNtk->nConstrs * -4) {
        Abc_NtkDupObj(pNtk,pAVar3,0);
        pAVar12 = (pAVar3->field_6).pCopy;
        pcVar9 = Abc_ObjName(pAVar3);
        Abc_ObjAssignName(pAVar12,pcVar9,"_frame1");
        Abc_ObjAddFanin((pAVar3->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x40));
      }
      else {
        pAVar12 = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
        Abc_ObjPatchFanin(pAVar3,pAVar12,(pAVar12->field_6).pCopy);
      }
      uVar22 = uVar22 + 1;
      pVVar13 = pNtk->vPos;
    } while ((long)uVar22 < (long)pVVar13->nSize);
  }
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkFrameExtend( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vFanins, * vNodes;
    Abc_Obj_t * pObj, * pFanin, * pReset, * pEnable, * pSignal;
    Abc_Obj_t * pResetN, * pEnableN, * pAnd0, * pAnd1, * pMux;
    int i, k, iStartPo, nPisOld = Abc_NtkPiNum(pNtk), nPosOld = Abc_NtkPoNum(pNtk);
    // skip if there are no flops
    if ( pNtk->nConstrs == 0 )
        return;
    assert( Abc_NtkPiNum(pNtk) >= pNtk->nConstrs );
    assert( Abc_NtkPoNum(pNtk) >= pNtk->nConstrs * 4 );
    // collect nodes
    vNodes = Vec_PtrAlloc( Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        Vec_PtrPush( vNodes, pObj );
    // duplicate PIs
    vFanins = Vec_PtrAlloc( 2 );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        if ( i == nPisOld )
            break;
        if ( i < nPisOld - pNtk->nConstrs )
        {
            Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_frame1" );
            continue;
        }
        // create flop input
        iStartPo = nPosOld + 4 * (i - nPisOld);
        pReset   = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 1 ) );
        pEnable  = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 2 ) );
        pSignal  = Abc_ObjFanin0( Abc_NtkPo( pNtk, iStartPo + 3 ) );
        pResetN  = Abc_NtkCreateNodeInv( pNtk, pReset );
        pEnableN = Abc_NtkCreateNodeInv( pNtk, pEnable );
        Vec_PtrFillTwo( vFanins, 2, pEnableN, pObj );
        pAnd0    = Abc_NtkCreateNodeAnd( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pEnable, pSignal );
        pAnd1    = Abc_NtkCreateNodeAnd( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pAnd0, pAnd1 );
        pMux     = Abc_NtkCreateNodeOr( pNtk, vFanins );
        Vec_PtrFillTwo( vFanins, 2, pResetN, pMux );
        pObj->pCopy = Abc_NtkCreateNodeAnd( pNtk, vFanins );
    }
    // duplicate internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_NtkDupObj( pNtk, pObj, 0 );
    // connect objects
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // create new POs and reconnect flop inputs
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( i == nPosOld )
            break;
        if ( i < nPosOld - 4 * pNtk->nConstrs )
        {
            Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), "_frame1" );
            Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pObj)->pCopy );
            continue;
        }
        Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), Abc_ObjFanin0(pObj)->pCopy );
    }
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vNodes );
}